

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_equation_units.cpp
# Opt level: O2

void __thiscall
beaufort_beaufortTests_Test::~beaufort_beaufortTests_Test(beaufort_beaufortTests_Test *this)

{
  testing::Test::~Test
            ((Test *)&this[-1].super_beaufort.super_TestWithParam<std::pair<double,_float>_>.
                      super_Test.gtest_flag_saver_);
  return;
}

Assistant:

TEST_P(beaufort, beaufortTests)
{
    auto p = GetParam();
    auto bnumber = p.first;
    auto wspeed = static_cast<double>(p.second);

    auto conv = convert(wspeed, precise::mph, precise::special::beaufort);

    EXPECT_EQ(std::round(conv), std::floor(bnumber));
    EXPECT_NEAR(
        convert(conv, precise::special::beaufort, precise::mph), wspeed, 0.5);
}